

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPlusTree.h
# Opt level: O3

void __thiscall
BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table>_>
::clear_tree(BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table>_>
             *this)

{
  Array<BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table>_>_*>
  *this_00;
  BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table>_>
  *this_01;
  BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table>_>
  **ppBVar1;
  size_t index;
  
  if (this->subset_size != 0) {
    this_00 = &this->subset;
    index = 0;
    do {
      ppBVar1 = b_array::
                Array<BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table>_>_*>
                ::operator[](this_00,index);
      if (*ppBVar1 !=
          (BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table>_>
           *)0x0) {
        ppBVar1 = b_array::
                  Array<BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table>_>_*>
                  ::operator[](this_00,index);
        clear_tree(*ppBVar1);
        ppBVar1 = b_array::
                  Array<BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table>_>_*>
                  ::operator[](this_00,index);
        this_01 = *ppBVar1;
        if (this_01 !=
            (BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table>_>
             *)0x0) {
          ~BPlusTree(this_01);
        }
        operator_delete(this_01);
        ppBVar1 = b_array::
                  Array<BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table>_>_*>
                  ::operator[](this_00,index);
        *ppBVar1 = (BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table>_>
                    *)0x0;
      }
      index = index + 1;
    } while (index < this->subset_size);
  }
  erase_node(this);
  return;
}

Assistant:

void BPlusTree<T>::clear_tree() {
    for (size_t i = 0; i < subset_size; ++i) {
        if (subset[i] != nullptr) {
            subset[i]->clear_tree();
            delete subset[i];
            subset[i] = nullptr;
        }
    }
    erase_node();
}